

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O2

int deqp::gles31::Functional::NegativeTestShared::anon_unknown_4::getMaxSSBlockSize
              (NegativeTestContext *ctx,GLenum glShaderType)

{
  GLenum pname;
  int maxSSBlocks;
  
  maxSSBlocks = 0;
  if (glShaderType == 0x91b9) {
    pname = 0x90db;
  }
  else if (glShaderType == 0x8b31) {
    pname = 0x90d6;
  }
  else if (glShaderType == 0x8dd9) {
    pname = 0x90d7;
  }
  else if (glShaderType == 0x8e87) {
    pname = 0x90d9;
  }
  else if (glShaderType == 0x8e88) {
    pname = 0x90d8;
  }
  else if (glShaderType == 0x8b30) {
    pname = 0x90da;
  }
  else {
    pname = 0xffffffff;
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,pname,&maxSSBlocks);
  return maxSSBlocks;
}

Assistant:

int getMaxSSBlockSize (NegativeTestContext& ctx, glw::GLenum glShaderType)
{
	int maxSSBlocks = 0;
	ctx.glGetIntegerv(getMaxSSBlockSizeEnum(glShaderType), &maxSSBlocks);

	return maxSSBlocks;
}